

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

void __thiscall BPlusTree::PrintNodeWithoutPtr(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  pointer pfVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  
  std::operator<<((ostream *)&std::cout,"[");
  for (uVar4 = 0; peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      pfVar2 = (peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
      uVar4 = uVar4 + 1) {
    std::ostream::operator<<(&std::cout,pfVar2[uVar4]);
    peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar4 != ((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) - 1U) {
      std::operator<<((ostream *)&std::cout," | ");
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void BPlusTree::PrintNodeWithoutPtr(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->keys[i];
        if (i != node->keys.size() - 1) {
            std::cout << " | ";
        }
    }
    std::cout << "]" << std::endl;
}